

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMControlDependenceAnalysisImpl.h
# Opt level: O2

void __thiscall
dg::LLVMControlDependenceAnalysisImpl::LLVMControlDependenceAnalysisImpl
          (LLVMControlDependenceAnalysisImpl *this,Module *module,
          LLVMControlDependenceAnalysisOptions *opts)

{
  this->_vptr_LLVMControlDependenceAnalysisImpl =
       (_func_int **)&PTR__LLVMControlDependenceAnalysisImpl_0012eb30;
  this->_module = module;
  LLVMControlDependenceAnalysisOptions::LLVMControlDependenceAnalysisOptions(&this->_options,opts);
  return;
}

Assistant:

LLVMControlDependenceAnalysisImpl(const llvm::Module *module,
                                      LLVMControlDependenceAnalysisOptions opts)
            : _module(module), _options(std::move(opts)) {}